

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isConsonant(char *z)

{
  int iVar1;
  bool local_1e;
  char x;
  int j;
  char *z_local;
  
  if (*z == '\0') {
    z_local._4_4_ = 0;
  }
  else {
    z_local._4_4_ = (uint)""[*z + -0x61];
    if (1 < (int)z_local._4_4_) {
      local_1e = true;
      if (z[1] != '\0') {
        iVar1 = isVowel(z + 1);
        local_1e = iVar1 != 0;
      }
      z_local._4_4_ = (uint)local_1e;
    }
  }
  return z_local._4_4_;
}

Assistant:

static int isConsonant(const char *z){
  int j;
  char x = *z;
  if( x==0 ) return 0;
  assert( x>='a' && x<='z' );
  j = cType[x-'a'];
  if( j<2 ) return j;
  return z[1]==0 || isVowel(z + 1);
}